

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool Internal_UnclampedKnots(int order,int cv_count,double *cv,double *knot)

{
  bool local_22;
  bool local_21;
  double *knot_local;
  double *cv_local;
  int cv_count_local;
  int order_local;
  
  local_21 = false;
  if (((((2 < order) && (local_21 = false, order <= cv_count)) &&
       (local_21 = false, cv != (double *)0x0)) &&
      ((local_21 = false, knot != (double *)0x0 &&
       (local_21 = false, -1.23432101234321e+308 < *knot)))) &&
     ((local_21 = false,
      knot[cv_count + order + -3] <= 1.23432101234321e+308 &&
      knot[cv_count + order + -3] != 1.23432101234321e+308 &&
      ((local_21 = false, knot[order + -2] < knot[order + -1] - 2.3283064365386963e-10 &&
       (local_21 = false, knot[cv_count + -2] < knot[cv_count + -1] - 2.3283064365386963e-10)))))) {
    local_22 = true;
    if (knot[order + -2] - 2.3283064365386963e-10 <= *knot) {
      local_22 = knot[cv_count + -1] < knot[cv_count + order + -3] - 2.3283064365386963e-10;
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

static bool Internal_UnclampedKnots(
  int order,
  int cv_count,
  const double* cv,
  const double* knot
  )
{
  return
    order >= 3
    && cv_count >= order
    && nullptr != cv
    && nullptr != knot
    && knot[0] > ON_UNSET_VALUE
    && knot[cv_count + order - 3] < ON_UNSET_POSITIVE_VALUE
    && knot[order - 2] < knot[order - 1] - ON_ZERO_TOLERANCE
    && knot[cv_count - 2] < knot[cv_count - 1] - ON_ZERO_TOLERANCE
    && ((knot[0] < knot[order - 2] - ON_ZERO_TOLERANCE) || (knot[cv_count - 1] < knot[cv_count + order - 3] - ON_ZERO_TOLERANCE))
    ;
}